

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O2

void __thiscall pstack::Procman::Process::~Process(Process *this)

{
  Context *pCVar1;
  __shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  this->_vptr_Process = (_func_int **)&PTR_findRDebugAddr_00151728;
  pCVar1 = this->context;
  std::__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,
             &(this->vdsoImage).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)
  ;
  pstack::Context::flush(pCVar1,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  td_ta_delete(this->agent);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->io).super___shared_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__cxx11::string::~string((string *)&this->abiPrefix);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->vdsoImage).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->execImage).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_pstack::Procman::MappedObject>,_std::_Select1st<std::pair<const_unsigned_long,_pstack::Procman::MappedObject>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_pstack::Procman::MappedObject>_>_>
  ::~_Rb_tree(&(this->objects)._M_t);
  return;
}

Assistant:

Process::~Process()
{
    // don't leave the VDSO in the cache - a new copy will be entered for a new
    // process.
    context.flush(vdsoImage);
    td_ta_delete(agent);
}